

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::expression_is_constant_null(CompilerGLSL *this,uint32_t id)

{
  SPIRConstant *this_00;
  SPIRConstant *c;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  this_00 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,id);
  if (this_00 == (SPIRConstant *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = SPIRConstant::constant_is_null(this_00);
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::expression_is_constant_null(uint32_t id) const
{
	auto *c = maybe_get<SPIRConstant>(id);
	if (!c)
		return false;
	return c->constant_is_null();
}